

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

void STAT_Serialize(FSerializer *arc)

{
  uint amount;
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  FString startlevel;
  
  amount = LevelData.Count;
  startlevel.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  bVar2 = FSerializer::BeginObject(arc,"statistics");
  if (bVar2) {
    if (arc->r == (FReader *)0x0) {
      if (StartEpisode != (FEpisode *)0x0) {
        FString::operator=(&startlevel,&StartEpisode->mEpisodeMap);
      }
      FSerializer::operator()(arc,"startlevel",&startlevel);
    }
    else {
      FSerializer::operator()(arc,"startlevel",&startlevel);
      StartEpisode = (FEpisode *)0x0;
      uVar4 = 0xffffffffffffffff;
      lVar1 = -0x20;
      do {
        lVar5 = lVar1;
        uVar4 = uVar4 + 1;
        if (AllEpisodes.Count <= uVar4) goto LAB_00482446;
        iVar3 = FString::CompareNoCase
                          ((FString *)((long)&AllEpisodes.Array[1].mEpisodeMap.Chars + lVar5),
                           &startlevel);
        lVar1 = lVar5 + 0x20;
      } while (iVar3 != 0);
      StartEpisode = (FEpisode *)((long)&AllEpisodes.Array[1].mEpisodeName.Chars + lVar5);
LAB_00482446:
      TArray<OneLevel,_OneLevel>::Resize(&LevelData,amount);
    }
    FSerializer::operator()(arc,"levels",&LevelData);
    FSerializer::EndObject(arc);
  }
  FString::~FString(&startlevel);
  return;
}

Assistant:

void STAT_Serialize(FSerializer &arc)
{
	FString startlevel;
	int i = LevelData.Size();

	if (arc.BeginObject("statistics"))
	{
		if (arc.isReading())
		{
			arc("startlevel", startlevel);
			StartEpisode = NULL;
			for (unsigned int j = 0; j < AllEpisodes.Size(); j++)
			{
				if (!AllEpisodes[j].mEpisodeMap.CompareNoCase(startlevel))
				{
					StartEpisode = &AllEpisodes[j];
					break;
				}
			}
			LevelData.Resize(i);
		}
		else
		{
			if (StartEpisode != NULL) startlevel = StartEpisode->mEpisodeMap;
			arc("startlevel", startlevel);
		}
		arc("levels", LevelData);
		arc.EndObject();
	}
}